

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O2

void __thiscall lsim::gui::CircuitEditor::ui_fix_wire(CircuitEditor *this,ModelWire *wire)

{
  bool bVar1;
  ModelWireSegment *pMVar2;
  ModelWire *this_00;
  ModelWireJunction *p0;
  ModelWireJunction *p1;
  _Base_ptr p_Var3;
  segment_set_t reachable_segments;
  
  ModelWire::clear_pins(wire);
  bVar1 = ModelWire::in_one_piece(wire);
  if (!bVar1) {
    while ((wire->m_segments).
           super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           (wire->m_segments).
           super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) {
      pMVar2 = ModelWire::segment_by_index(wire,0);
      ModelWire::reachable_segments(&reachable_segments,wire,pMVar2);
      this_00 = ModelCircuit::create_wire(this->m_model_circuit);
      for (p_Var3 = reachable_segments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &reachable_segments._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        pMVar2 = *(ModelWireSegment **)(p_Var3 + 1);
        p0 = ModelWireSegment::junction(pMVar2,0);
        p1 = ModelWireSegment::junction(pMVar2,1);
        ModelWire::add_segment(this_00,&p0->m_position,&p1->m_position);
        ModelWire::remove_segment(wire,pMVar2);
      }
      ModelWire::simplify(this_00);
      wire_make_connections(this,this_00);
      std::
      _Rb_tree<lsim::ModelWireSegment_*,_lsim::ModelWireSegment_*,_std::_Identity<lsim::ModelWireSegment_*>,_std::less<lsim::ModelWireSegment_*>,_std::allocator<lsim::ModelWireSegment_*>_>
      ::~_Rb_tree(&reachable_segments._M_t);
    }
    ModelCircuit::remove_wire(this->m_model_circuit,wire->m_id);
    return;
  }
  ModelWire::simplify(wire);
  wire_make_connections(this,wire);
  return;
}

Assistant:

void CircuitEditor::ui_fix_wire(ModelWire* wire) {
	wire->clear_pins();

	if (!wire->in_one_piece()) {
		while (wire->num_segments() > 0) {
			auto reachable_segments = wire->reachable_segments(wire->segment_by_index(0));
			ModelWire* new_wire = m_model_circuit->create_wire();

			for (auto segment : reachable_segments) {
				new_wire->add_segment(segment->junction(0)->position(), segment->junction(1)->position());
				wire->remove_segment(segment);
			}

			new_wire->simplify();
			wire_make_connections(new_wire);
		}

		m_model_circuit->remove_wire(wire->id());
	} else {
		wire->simplify();
		wire_make_connections(wire);
	}
}